

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

bool __thiscall
iutest::detail::PropertyMatcher<int(test::syntax_tests::X::*)()const,int>::
Check<test::syntax_tests::X*>
          (PropertyMatcher<int(test::syntax_tests::X::*)()const,int> *this,X **actual,type **param_2
          )

{
  code *pcVar1;
  int local_4c;
  EqMatcher<int> local_48;
  AssertionResult local_38;
  
  local_48.m_expected = (int *)(this + 0x10);
  local_48.super_IMatcher._vptr_IMatcher = (_func_int **)&PTR__IMatcher_0039f6f8;
  pcVar1 = (code *)**(ulong **)(this + 8);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)((long)&(*actual)->a + (*(ulong **)(this + 8))[1]) + -1);
  }
  local_4c = (*pcVar1)();
  EqMatcher<int>::operator()(&local_38,&local_48,&local_4c);
  std::__cxx11::string::~string((string *)&local_38);
  return local_38.m_result;
}

Assistant:

bool Check(const U& actual
        , typename detail::enable_if_t< detail::is_pointer<U> >::type*& = detail::enabler::value)
    {
        return static_cast<bool>(CastToMatcher(m_expected)((actual->*m_property)()));
    }